

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O2

void mc_wrench_invert(mc_wrench *f,mc_wrench *r,int count)

{
  uint __line;
  char *__assertion;
  
  if (f == (mc_wrench *)0x0) {
    __assertion = "f";
    __line = 0x7c;
  }
  else {
    if (r != (mc_wrench *)0x0) {
      la_dscal_o(count * 3,-1.0,(double *)f->torque,1,(double *)r->torque,1);
      la_dscal_o(count * 3,-1.0,(double *)f->force,1,(double *)r->force,1);
      return;
    }
    __assertion = "r";
    __line = 0x7d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,__line,"void mc_wrench_invert(const struct mc_wrench *, struct mc_wrench *, int)");
}

Assistant:

void mc_wrench_invert(
        const struct mc_wrench *f,
        struct mc_wrench *r,
        int count)
{
    assert(f);
    assert(r);

    la_dscal_o(3 * count, -1.0, (double *)f->torque, 1, (double *)r->torque, 1);
    la_dscal_o(3 * count, -1.0, (double *)f->force, 1, (double *)r->force, 1);
}